

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass1.cpp
# Opt level: O2

void writeSymbolTable(string *path,
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
                     *symtab)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *this;
  __node_base *p_Var5;
  allocator local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  value_type it;
  ofstream ofs;
  undefined8 uStack_220;
  uint auStack_218 [2];
  byte abStack_210 [480];
  
  std::ofstream::ofstream(&ofs,(string *)path,_S_out);
  if ((abStack_210[*(long *)(_ofs + -0x18)] & 5) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Writing SYMTAB to ");
    poVar4 = std::operator<<(poVar4,(string *)path);
    std::endl<char,std::char_traits<char>>(poVar4);
    puVar1 = (uint *)((long)auStack_218 + *(long *)(_ofs + -0x18));
    *puVar1 = *puVar1 | 0x20;
    *(undefined8 *)((long)&uStack_220 + *(long *)(_ofs + -0x18)) = 0xc;
    poVar4 = std::operator<<((ostream *)&ofs,"SYMBOL");
    poVar4 = std::operator<<(poVar4,"ADDRESS");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    p_Var5 = &(symtab->_M_h)._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>
      ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>
                  *)(p_Var5 + 1));
      *(undefined8 *)((long)&uStack_220 + *(long *)(_ofs + -0x18)) = 0xc;
      puVar1 = (uint *)((long)auStack_218 + *(long *)(_ofs + -0x18));
      *puVar1 = *puVar1 & 0xffffbfff;
      poVar4 = std::operator<<((ostream *)&ofs,(string *)&it);
      lVar2 = *(long *)poVar4;
      *(uint *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
      iVar3 = cs222::Symbol::getValue(&it.second);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>
      ::~pair(&it);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&ofs);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_298,"Cannot open file: ",&local_299);
  std::operator+(&it.first,&local_298,path);
  std::runtime_error::runtime_error(this,(string *)&it);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void writeSymbolTable(
        const std::string& path,
        const std::unordered_map<std::string, cs222::Symbol>& symtab)
{
    std::ofstream ofs(path);
    if (!ofs)
        throw std::runtime_error(std::string("Cannot open file: ") + path);

    std::cout << "Writing SYMTAB to " << path << std::endl;
    ofs.setf(std::ios::left);
    ofs << std::setw(12) << "SYMBOL" << "ADDRESS" << std::endl << std::endl;
    for (auto it : symtab)
    {
        ofs << std::setw(12) << std::nouppercase << it.first
            << std::uppercase << std::hex << it.second.getValue() << std::endl;
    }
    ofs.close();
}